

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::SolverParameter::SolverParameter(SolverParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SolverParameter_0071c610;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = 0;
  (this->test_net_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->test_net_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->test_net_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->test_net_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->test_iter_).current_size_ = 0;
  (this->test_iter_).total_size_ = 0;
  (this->test_iter_).rep_ = (Rep *)0x0;
  (this->test_net_param_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->test_net_param_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->test_net_param_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->test_net_param_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->test_state_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->test_state_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->test_state_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->test_state_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->stepvalue_).current_size_ = 0;
  (this->stepvalue_).total_size_ = 0;
  (this->stepvalue_).rep_ = (Rep *)0x0;
  if (this != (SolverParameter *)&_SolverParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  caffe::SolverParameter((caffe *)this);
  return;
}

Assistant:

SolverParameter::SolverParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.SolverParameter)
}